

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONScanner.cpp
# Opt level: O0

tokens __thiscall JSON::JSONScanner::ScanString(JSONScanner *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  char16 cVar4;
  BOOL BVar5;
  uint uVar6;
  undefined4 *puVar7;
  RangeCharacterPairList *pRVar8;
  char16 *pcVar9;
  uint oldIndex_1;
  byte local_3d;
  uint local_3c;
  undefined1 local_38 [3];
  bool shouldSkipLastCharacter;
  uint oldIndex;
  uint local_2c;
  int local_28;
  int chcode;
  int tempHex;
  uint bulkLength;
  LPCWSTR bulkStart;
  bool isStringDirectInputTextMapped;
  bool endFound;
  JSONScanner *pJStack_10;
  char16 ch;
  JSONScanner *this_local;
  
  this->currentIndex = 0;
  this->currentString = this->currentChar;
  bulkStart._5_1_ = 0;
  bulkStart._4_1_ = 1;
  _tempHex = this->currentChar;
  chcode = 0;
  pJStack_10 = this;
  do {
    if (this->inputText + this->inputLen <= this->currentChar) {
LAB_010b5886:
      if ((bulkStart._5_1_ & 1) == 0) {
        ThrowSyntaxError(this,-0x7ff5e9e7);
      }
      if ((bulkStart._4_1_ & 1) == 0) {
        local_3d = 0;
        if (chcode != 0) {
          local_3d = 1;
          pRVar8 = GetCurrentRangeCharacterPairList(this);
          RangeCharacterPair::RangeCharacterPair
                    ((RangeCharacterPair *)&stack0xffffffffffffffb4,
                     (uint)((long)_tempHex - (long)this->inputText >> 1),chcode,L'\0');
          JsUtil::
          List<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(pRVar8,(RangeCharacterPair *)&stack0xffffffffffffffb4);
          uVar1 = this->currentIndex;
          this->currentIndex = chcode + this->currentIndex;
          if (this->currentIndex < uVar1) {
            Js::Throw::OutOfMemory();
          }
        }
        BuildUnescapedString(this,(bool)(local_3d & 1));
        pRVar8 = GetCurrentRangeCharacterPairList(this);
        JsUtil::
        List<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Clear(pRVar8);
        this->currentString = this->stringBuffer;
      }
      else {
        this->currentIndex = chcode;
        uVar6 = GetCurrentStringLen(this);
        pcVar9 = GetCurrentString(this);
        Output::TraceWithFlush
                  (JSONPhase,L"ScanString(): direct-mapped string as \'%.*s\'\n",(ulong)uVar6,pcVar9
                  );
      }
      this->pToken->tk = tkStrCon;
      return tkStrCon;
    }
    bulkStart._6_2_ = ReadNextChar(this);
    if (bulkStart._6_2_ == L'\"') {
      bulkStart._5_1_ = 1;
      goto LAB_010b5886;
    }
    if ((ushort)bulkStart._6_2_ < 0x20) {
      ThrowSyntaxError(this,-0x7ff5e9e9);
    }
    if (bulkStart._6_2_ == L'\0') {
      this->currentChar = this->currentChar + -1;
      ThrowSyntaxError(this,-0x7ff5e9e7);
    }
    if (bulkStart._6_2_ == L'\\') {
      if (this->inputText + this->inputLen <= this->currentChar) {
        ThrowSyntaxError(this,-0x7ff5e9e7);
      }
      bulkStart._6_2_ = ReadNextChar(this);
      if (bulkStart._6_2_ == L'\0') {
        this->currentChar = this->currentChar + -1;
        ThrowSyntaxError(this,-0x7ff5e9e7);
      }
      if (((bulkStart._6_2_ != L'\"') && (bulkStart._6_2_ != L'/')) && (bulkStart._6_2_ != L'\\')) {
        if (bulkStart._6_2_ == L'b') {
          bulkStart._6_2_ = L'\b';
        }
        else if (bulkStart._6_2_ == L'f') {
          bulkStart._6_2_ = L'\f';
        }
        else if (bulkStart._6_2_ == L'n') {
          bulkStart._6_2_ = L'\n';
        }
        else if (bulkStart._6_2_ == L'r') {
          bulkStart._6_2_ = L'\r';
        }
        else if (bulkStart._6_2_ == L't') {
          bulkStart._6_2_ = L'\t';
        }
        else {
          if (bulkStart._6_2_ != L'u') {
            ThrowSyntaxError(this,-0x7ff5e9e9);
          }
          if (this->inputText + this->inputLen <= this->currentChar + 3) {
            ThrowSyntaxError(this,-0x7ff5e9e7);
          }
          cVar4 = ReadNextChar(this);
          BVar5 = Js::NumberUtilities::FHexDigit(cVar4,&local_28);
          if (BVar5 == 0) {
            ThrowSyntaxError(this,-0x7ff5e9e8);
          }
          local_2c = local_28 << 0xc;
          cVar4 = ReadNextChar(this);
          BVar5 = Js::NumberUtilities::FHexDigit(cVar4,&local_28);
          if (BVar5 == 0) {
            ThrowSyntaxError(this,-0x7ff5e9e8);
          }
          local_2c = local_28 * 0x100 + local_2c;
          cVar4 = ReadNextChar(this);
          BVar5 = Js::NumberUtilities::FHexDigit(cVar4,&local_28);
          if (BVar5 == 0) {
            ThrowSyntaxError(this,-0x7ff5e9e8);
          }
          local_2c = local_28 * 0x10 + local_2c;
          cVar4 = ReadNextChar(this);
          BVar5 = Js::NumberUtilities::FHexDigit(cVar4,&local_28);
          if (BVar5 == 0) {
            ThrowSyntaxError(this,-0x7ff5e9e8);
          }
          local_2c = local_28 + local_2c;
          if (local_2c != (local_2c & 0xffff)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                               ,0x14a,"(chcode == (chcode & 0xFFFF))","Bad unicode code");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          bulkStart._6_2_ = (char16)local_2c;
        }
      }
      pRVar8 = GetCurrentRangeCharacterPairList(this);
      RangeCharacterPair::RangeCharacterPair
                ((RangeCharacterPair *)local_38,(uint)((long)_tempHex - (long)this->inputText >> 1),
                 chcode,bulkStart._6_2_);
      JsUtil::
      List<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add(pRVar8,(RangeCharacterPair *)local_38);
      local_3c = this->currentIndex;
      this->currentIndex = chcode + this->currentIndex;
      this->currentIndex = this->currentIndex + 1;
      if (this->currentIndex < local_3c) {
        Js::Throw::OutOfMemory();
      }
      bulkStart._4_1_ = 0;
      _tempHex = this->currentChar;
      chcode = 0;
    }
    else {
      chcode = chcode + 1;
    }
  } while( true );
}

Assistant:

tokens JSONScanner::ScanString()
    {
        char16 ch;

        this->currentIndex = 0;
        this->currentString = const_cast<char16*>(currentChar);
        bool endFound = false;
        bool isStringDirectInputTextMapped = true;
        LPCWSTR bulkStart = currentChar;
        uint bulkLength = 0;

        while (currentChar < inputText + inputLen)
        {
            ch = ReadNextChar();
            int tempHex;

            if (ch == '"')
            {
                //end of the string
                endFound = true;
                break;
            }
            else if (ch <= 0x1F)
            {
                //JSON doesn't accept \u0000 - \u001f range, LS(\u2028) and PS(\u2029) are ok
               ThrowSyntaxError(JSERR_JsonIllegalChar);
            }
            else if ( 0 == ch )
            {
                currentChar--;
               ThrowSyntaxError(JSERR_JsonNoStrEnd);
            }
            else if ('\\' == ch)
            {
                //JSON escape sequence in a string \", \/, \\, \b, \f, \n, \r, \t, unicode seq
                // unlikely V5.8 regular chars are not escaped, i.e '\g'' in a string is illegal not 'g'
                if (currentChar >= inputText + inputLen )
                {
                   ThrowSyntaxError(JSERR_JsonNoStrEnd);
                }

                ch = ReadNextChar();
                switch (ch)
                {
                case 0:
                    currentChar--;
                   ThrowSyntaxError(JSERR_JsonNoStrEnd);

                case '"':
                case '/':
                case '\\':
                    //keep ch
                    break;

                case 'b':
                    ch = 0x08;
                    break;

                case 'f':
                    ch = 0x0C;
                    break;

                case 'n':
                    ch = 0x0A;
                    break;

                case 'r':
                    ch = 0x0D;
                    break;

                case 't':
                    ch = 0x09;
                    break;

                case 'u':
                    {
                        int chcode;
                        // 4 hex digits
                        if (currentChar + 3 >= inputText + inputLen)
                        {
                            //no room left for 4 hex chars
                           ThrowSyntaxError(JSERR_JsonNoStrEnd);

                        }
                        if (!Js::NumberUtilities::FHexDigit((WCHAR)ReadNextChar(), &tempHex))
                        {
                           ThrowSyntaxError(JSERR_JsonBadHexDigit);
                        }
                        chcode = tempHex * 0x1000;

                        if (!Js::NumberUtilities::FHexDigit((WCHAR)ReadNextChar(), &tempHex))
                        {
                           ThrowSyntaxError(JSERR_JsonBadHexDigit);
                        }
                        chcode += tempHex * 0x0100;

                        if (!Js::NumberUtilities::FHexDigit((WCHAR)ReadNextChar(), &tempHex))
                        {
                           ThrowSyntaxError(JSERR_JsonBadHexDigit);
                        }
                        chcode += tempHex * 0x0010;

                        if (!Js::NumberUtilities::FHexDigit((WCHAR)ReadNextChar(), &tempHex))
                        {
                           ThrowSyntaxError(JSERR_JsonBadHexDigit);
                        }
                        chcode += tempHex;
                        AssertMsg(chcode == (chcode & 0xFFFF), "Bad unicode code");
                        ch = (char16)chcode;
                    }
                    break;

                default:
                    // Any other '\o' is an error in JSON
                   ThrowSyntaxError(JSERR_JsonIllegalChar);
                }

                // flush
                this->GetCurrentRangeCharacterPairList()->Add(RangeCharacterPair((uint)(bulkStart - inputText), bulkLength, ch));

                uint oldIndex = currentIndex;
                currentIndex += bulkLength;
                currentIndex++;

                if (currentIndex < oldIndex)
                {
                    // Overflow
                    Js::Throw::OutOfMemory();
                }

                // mark the mode as 'string transformed' (no direct mapping in inputText possible)
                isStringDirectInputTextMapped = false;

                // reset (to next char)
                bulkStart = currentChar;
                bulkLength = 0;
            }
            else
            {
                // continue
                bulkLength++;
            }
        }

        if (!endFound)
        {
            // no ending '"' found
           ThrowSyntaxError(JSERR_JsonNoStrEnd);
        }

        if (isStringDirectInputTextMapped == false)
        {
            // If the last bulk is not ended with an escape character, make sure that is
            // not built into the final unescaped string
            bool shouldSkipLastCharacter = false;
            if (bulkLength > 0)
            {
                shouldSkipLastCharacter = true;
                this->GetCurrentRangeCharacterPairList()->Add(RangeCharacterPair((uint)(bulkStart - inputText), bulkLength, _u('\0')));
                uint oldIndex = currentIndex;
                currentIndex += bulkLength;
                if (currentIndex < oldIndex)
                {
                    // Overflow
                    Js::Throw::OutOfMemory();
                }
            }

            this->BuildUnescapedString(shouldSkipLastCharacter);
            this->GetCurrentRangeCharacterPairList()->Clear();
            this->currentString = this->stringBuffer;
        }
        else
        {
            // make currentIndex the length (w/o the \0)
            currentIndex = bulkLength;

            OUTPUT_TRACE_DEBUGONLY(Js::JSONPhase, _u("ScanString(): direct-mapped string as '%.*s'\n"),
                GetCurrentStringLen(), GetCurrentString());
        }

        return (pToken->tk = tkStrCon);
    }